

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  ulong uVar1;
  bool bVar2;
  istream *piVar3;
  size_type sVar4;
  char *pcVar5;
  ostream *poVar6;
  string *in_RSI;
  long in_RDI;
  string *in_R8;
  stringstream ss_1;
  ifstream matIStream_1;
  string *in_stack_00000360;
  string *in_stack_00000368;
  istream *in_stack_00000370;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *in_stack_00000378;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000380;
  string filepath_1;
  stringstream ss;
  ifstream matIStream;
  string filepath;
  size_t i;
  string s;
  istringstream f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  char sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5d0;
  value_type *in_stack_fffffffffffff5d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff5e0;
  string local_9b8 [8];
  string *in_stack_fffffffffffff650;
  string *in_stack_fffffffffffff658;
  stringstream local_998 [16];
  ostream local_988 [376];
  long local_810 [65];
  string local_608 [32];
  string local_5e8 [32];
  stringstream local_5c8 [16];
  ostream local_5b8 [380];
  uint local_43c;
  long local_438 [65];
  string local_230 [32];
  ulong local_210;
  string local_208 [48];
  istringstream local_1d8 [384];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char local_39;
  string *local_30;
  string *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_18 = in_RSI;
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a9b4d);
  if (bVar2) {
    std::__cxx11::string::string(local_608,local_18);
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (in_stack_fffffffffffff5d0);
    std::ifstream::ifstream(local_810,pcVar5,_S_in);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)local_810 + *(long *)(local_810[0] + -0x18)));
    if (bVar2) {
      LoadMtl(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368,
              in_stack_00000360);
      local_1 = 1;
      local_43c = 1;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_998);
      poVar6 = std::operator<<(local_988,"Material file [ ");
      poVar6 = std::operator<<(poVar6,local_608);
      poVar6 = std::operator<<(poVar6," ] not found in a path : ");
      poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 8));
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      if (local_30 != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_30,local_9b8);
        std::__cxx11::string::~string(local_9b8);
      }
      local_1 = 0;
      local_43c = 1;
      std::__cxx11::stringstream::~stringstream(local_998);
    }
    std::ifstream::~ifstream(local_810);
    std::__cxx11::string::~string(local_608);
  }
  else {
    local_39 = ':';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1a9b6a);
    std::__cxx11::istringstream::istringstream(local_1d8,(string *)(in_RDI + 8),_S_in);
    std::__cxx11::string::string(local_208);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1d8,local_208,local_39);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
    }
    for (local_210 = 0; uVar1 = local_210,
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_58), uVar1 < sVar4; local_210 = local_210 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_58,local_210);
      JoinPath(in_stack_fffffffffffff658,in_stack_fffffffffffff650);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(in_stack_fffffffffffff5d0);
      std::ifstream::ifstream(local_438,pcVar5,_S_in);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)local_438 + *(long *)(local_438[0] + -0x18)));
      if (bVar2) {
        LoadMtl(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368,
                in_stack_00000360);
        local_1 = 1;
      }
      local_43c = (uint)bVar2;
      std::ifstream::~ifstream(local_438);
      std::__cxx11::string::~string(local_230);
      if (local_43c != 0) goto LAB_001a9ef4;
    }
    std::__cxx11::stringstream::stringstream(local_5c8);
    poVar6 = std::operator<<(local_5b8,"Material file [ ");
    poVar6 = std::operator<<(poVar6,local_18);
    poVar6 = std::operator<<(poVar6," ] not found in a path : ");
    poVar6 = std::operator<<(poVar6,(string *)(in_RDI + 8));
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    if (local_30 != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_30,local_5e8);
      std::__cxx11::string::~string(local_5e8);
    }
    local_1 = 0;
    local_43c = 1;
    std::__cxx11::stringstream::~stringstream(local_5c8);
LAB_001a9ef4:
    std::__cxx11::string::~string(local_208);
    std::__cxx11::istringstream::~istringstream(local_1d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffff5e0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}